

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

GLFWbool isValidElementForJoystick(_GLFWmapelement *e,_GLFWjoystick *js)

{
  uint8_t uVar1;
  
  uVar1 = e->type;
  if (uVar1 == '\x01') {
    if ((int)(uint)e->value < js->axisCount) {
      return 1;
    }
  }
  else if (uVar1 == '\x02') {
    if ((int)(uint)e->value < js->buttonCount) {
      return 1;
    }
  }
  else if ((uVar1 != '\x03') || ((int)(uint)(e->value >> 4) < js->hatCount)) {
    return 1;
  }
  return 0;
}

Assistant:

static GLFWbool isValidElementForJoystick(const _GLFWmapelement* e,
                                          const _GLFWjoystick* js)
{
    if (e->type == _GLFW_JOYSTICK_HATBIT && (e->value >> 4) >= js->hatCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_BUTTON && e->value >= js->buttonCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_AXIS && e->value >= js->axisCount)
        return GLFW_FALSE;

    return GLFW_TRUE;
}